

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O3

btScalar __thiscall
btSoftBodyConcaveCollisionAlgorithm::calculateTimeOfImpact
          (btSoftBodyConcaveCollisionAlgorithm *this,btCollisionObject *body0,
          btCollisionObject *body1,btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  btCollisionObject *pbVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  btTransform triInv;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_198;
  float local_194;
  float local_190;
  undefined8 local_188;
  float local_180;
  btTriangleCallback local_e0;
  undefined8 local_d8;
  float local_d0;
  undefined4 local_cc;
  undefined8 local_c8;
  float local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  float local_b0;
  undefined4 local_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  float local_90;
  undefined4 local_8c;
  undefined8 local_88;
  float local_80;
  undefined4 local_7c;
  undefined8 local_78;
  float local_70;
  undefined4 local_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  undefined4 uStack_5c;
  btScalar local_18;
  float local_14;
  
  pbVar12 = body0;
  if (this->m_isSwapped != false) {
    pbVar12 = body1;
  }
  fVar13 = (pbVar12->m_interpolationWorldTransform).m_origin.m_floats[0] -
           (pbVar12->m_worldTransform).m_origin.m_floats[0];
  fVar14 = (pbVar12->m_interpolationWorldTransform).m_origin.m_floats[1] -
           (pbVar12->m_worldTransform).m_origin.m_floats[1];
  fVar15 = (pbVar12->m_interpolationWorldTransform).m_origin.m_floats[2] -
           (pbVar12->m_worldTransform).m_origin.m_floats[2];
  if (pbVar12->m_ccdMotionThreshold * pbVar12->m_ccdMotionThreshold <=
      fVar15 * fVar15 + fVar13 * fVar13 + fVar14 * fVar14) {
    if (this->m_isSwapped != false) {
      body1 = body0;
    }
    btTransform::inverse(&body1->m_worldTransform);
    if (8 < body1->m_collisionShape->m_shapeType - 0x15U) {
      return 1.0;
    }
    uVar10 = *(undefined8 *)(pbVar12->m_worldTransform).m_basis.m_el[0].m_floats;
    fVar17 = (float)uVar10;
    fVar19 = (float)((ulong)uVar10 >> 0x20);
    uVar10 = *(undefined8 *)(pbVar12->m_worldTransform).m_basis.m_el[1].m_floats;
    fVar25 = (float)uVar10;
    fVar26 = (float)((ulong)uVar10 >> 0x20);
    fVar13 = (pbVar12->m_worldTransform).m_basis.m_el[0].m_floats[2];
    fVar14 = (pbVar12->m_worldTransform).m_basis.m_el[1].m_floats[2];
    fVar15 = (pbVar12->m_interpolationWorldTransform).m_basis.m_el[0].m_floats[2];
    fVar1 = (pbVar12->m_worldTransform).m_origin.m_floats[1];
    fVar2 = (pbVar12->m_worldTransform).m_origin.m_floats[0];
    fVar3 = (pbVar12->m_worldTransform).m_origin.m_floats[2];
    uVar10 = *(undefined8 *)(pbVar12->m_interpolationWorldTransform).m_basis.m_el[1].m_floats;
    fVar18 = (float)uVar10;
    fVar20 = (float)((ulong)uVar10 >> 0x20);
    uVar10 = *(undefined8 *)(pbVar12->m_interpolationWorldTransform).m_basis.m_el[0].m_floats;
    fVar21 = (float)uVar10;
    fVar22 = (float)((ulong)uVar10 >> 0x20);
    fVar4 = (pbVar12->m_interpolationWorldTransform).m_basis.m_el[1].m_floats[2];
    uVar10 = *(undefined8 *)(pbVar12->m_worldTransform).m_basis.m_el[2].m_floats;
    fVar27 = (float)uVar10;
    fVar29 = (float)((ulong)uVar10 >> 0x20);
    fVar5 = (pbVar12->m_worldTransform).m_basis.m_el[2].m_floats[2];
    fVar6 = (pbVar12->m_interpolationWorldTransform).m_basis.m_el[2].m_floats[2];
    uVar10 = *(undefined8 *)(pbVar12->m_interpolationWorldTransform).m_basis.m_el[2].m_floats;
    fVar28 = (float)uVar10;
    fVar30 = (float)((ulong)uVar10 >> 0x20);
    fVar7 = (pbVar12->m_interpolationWorldTransform).m_origin.m_floats[1];
    fVar8 = (pbVar12->m_interpolationWorldTransform).m_origin.m_floats[0];
    fVar9 = (pbVar12->m_interpolationWorldTransform).m_origin.m_floats[2];
    fStack_64 = (float)((ulong)local_188 >> 0x20);
    fVar23 = fVar3 * local_1b0 + fVar2 * local_1b8 + fVar1 * local_1b4 + (float)local_188;
    fVar24 = fVar3 * local_1a0 + fVar2 * local_1a8 + fVar1 * local_1a4 + fStack_64;
    local_68 = fVar9 * local_1b0 + fVar8 * local_1b8 + fVar7 * local_1b4 + (float)local_188;
    fStack_64 = fVar9 * local_1a0 + fVar8 * local_1a8 + fVar7 * local_1a4 + fStack_64;
    fStack_60 = local_190 * fVar9 + local_198 * fVar8 + local_194 * fVar7 + local_180;
    local_d0 = fVar5 * local_1b0 + fVar13 * local_1b8 + local_1b4 * fVar14;
    local_c0 = fVar5 * local_1a0 + fVar13 * local_1a8 + fVar14 * local_1a4;
    local_b0 = fVar5 * local_190 + fVar13 * local_198 + fVar14 * local_194;
    local_98 = CONCAT44(local_1b0 * fVar30 + local_1b8 * fVar22 + local_1b4 * fVar20,
                        local_1b0 * fVar28 + local_1b8 * fVar21 + local_1b4 * fVar18);
    local_90 = fVar6 * local_1b0 + fVar15 * local_1b8 + local_1b4 * fVar4;
    local_80 = fVar6 * local_1a0 + fVar15 * local_1a8 + local_1a4 * fVar4;
    local_70 = fVar6 * local_190 + fVar15 * local_198 + fVar4 * local_194;
    local_18 = pbVar12->m_ccdSweptSphereRadius;
    local_e0._vptr_btTriangleCallback = (_func_int **)&PTR__btTriangleCallback_00221908;
    local_d8 = CONCAT44(fVar29 * local_1b0 + fVar19 * local_1b8 + local_1b4 * fVar26,
                        fVar27 * local_1b0 + fVar17 * local_1b8 + local_1b4 * fVar25);
    local_cc = 0;
    local_c8 = CONCAT44(fVar29 * local_1a0 + fVar19 * local_1a8 + fVar26 * local_1a4,
                        fVar27 * local_1a0 + fVar17 * local_1a8 + fVar25 * local_1a4);
    local_bc = 0;
    local_b8 = CONCAT44(fVar29 * local_190 + fVar19 * local_198 + fVar26 * local_194,
                        fVar27 * local_190 + fVar17 * local_198 + fVar25 * local_194);
    local_ac = 0;
    local_a8._4_4_ = fVar24;
    local_a8._0_4_ = fVar23;
    local_a8._8_4_ = fVar3 * local_190 + fVar2 * local_198 + local_194 * fVar1 + local_180;
    local_a8._12_4_ = 0;
    local_8c = 0;
    local_88 = CONCAT44(local_1a0 * fVar30 + local_1a8 * fVar22 + local_1a4 * fVar20,
                        local_1a0 * fVar28 + local_1a8 * fVar21 + local_1a4 * fVar18);
    local_7c = 0;
    local_78 = CONCAT44(local_190 * fVar30 + local_198 * fVar22 + local_194 * fVar20,
                        local_190 * fVar28 + local_198 * fVar21 + local_194 * fVar18);
    auVar16._4_4_ = fStack_64;
    auVar16._0_4_ = local_68;
    auVar16._8_4_ = fVar9 * 0.0 + fVar8 * 0.0 + fVar7 * 0.0 + 0.0;
    auVar16._12_4_ = fVar9 * 0.0 + fVar8 * 0.0 + fVar7 * 0.0 + 0.0;
    local_6c = 0;
    uStack_5c = 0;
    auVar11._4_4_ = fVar24;
    auVar11._0_4_ = fVar23;
    auVar11._8_4_ = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 0.0 + 0.0;
    auVar11._12_4_ = fVar3 * 0.0 + fVar2 * 0.0 + fVar1 * 0.0 + 0.0;
    maxps(auVar16,auVar11);
    local_14 = pbVar12->m_hitFraction;
    (*body1->m_collisionShape->_vptr_btCollisionShape[0x10])();
    fVar13 = local_14;
    if (local_14 < pbVar12->m_hitFraction) {
      pbVar12->m_hitFraction = local_14;
      btTriangleCallback::~btTriangleCallback(&local_e0);
      return fVar13;
    }
    btTriangleCallback::~btTriangleCallback(&local_e0);
  }
  return 1.0;
}

Assistant:

btScalar btSoftBodyConcaveCollisionAlgorithm::calculateTimeOfImpact(btCollisionObject* body0,btCollisionObject* body1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	btCollisionObject* convexbody = m_isSwapped ? body1 : body0;
	btCollisionObject* triBody = m_isSwapped ? body0 : body1;


	//quick approximation using raycast, todo: hook up to the continuous collision detection (one of the btConvexCast)

	//only perform CCD above a certain threshold, this prevents blocking on the long run
	//because object in a blocked ccd state (hitfraction<1) get their linear velocity halved each frame...
	btScalar squareMot0 = (convexbody->getInterpolationWorldTransform().getOrigin() - convexbody->getWorldTransform().getOrigin()).length2();
	if (squareMot0 < convexbody->getCcdSquareMotionThreshold())
	{
		return btScalar(1.);
	}

	//const btVector3& from = convexbody->m_worldTransform.getOrigin();
	//btVector3 to = convexbody->m_interpolationWorldTransform.getOrigin();
	//todo: only do if the motion exceeds the 'radius'

	btTransform triInv = triBody->getWorldTransform().inverse();
	btTransform convexFromLocal = triInv * convexbody->getWorldTransform();
	btTransform convexToLocal = triInv * convexbody->getInterpolationWorldTransform();

	struct LocalTriangleSphereCastCallback	: public btTriangleCallback
	{
		btTransform m_ccdSphereFromTrans;
		btTransform m_ccdSphereToTrans;
		btTransform	m_meshTransform;

		btScalar	m_ccdSphereRadius;
		btScalar	m_hitFraction;


		LocalTriangleSphereCastCallback(const btTransform& from,const btTransform& to,btScalar ccdSphereRadius,btScalar hitFraction)
			:m_ccdSphereFromTrans(from),
			m_ccdSphereToTrans(to),
			m_ccdSphereRadius(ccdSphereRadius),
			m_hitFraction(hitFraction)
		{			
		}


		virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
		{
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			btTransform ident;
			ident.setIdentity();
			btConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			btSphereShape	pointShape(m_ccdSphereRadius);
			btTriangleShape	triShape(triangle[0],triangle[1],triangle[2]);
			btVoronoiSimplexSolver	simplexSolver;
			btSubsimplexConvexCast convexCaster(&pointShape,&triShape,&simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans,m_ccdSphereToTrans,
				ident,ident,castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}

		}

	};





	if (triBody->getCollisionShape()->isConcave())
	{
		btVector3 rayAabbMin = convexFromLocal.getOrigin();
		rayAabbMin.setMin(convexToLocal.getOrigin());
		btVector3 rayAabbMax = convexFromLocal.getOrigin();
		rayAabbMax.setMax(convexToLocal.getOrigin());
		btScalar ccdRadius0 = convexbody->getCcdSweptSphereRadius();
		rayAabbMin -= btVector3(ccdRadius0,ccdRadius0,ccdRadius0);
		rayAabbMax += btVector3(ccdRadius0,ccdRadius0,ccdRadius0);

		btScalar curHitFraction = btScalar(1.); //is this available?
		LocalTriangleSphereCastCallback raycastCallback(convexFromLocal,convexToLocal,
			convexbody->getCcdSweptSphereRadius(),curHitFraction);

		raycastCallback.m_hitFraction = convexbody->getHitFraction();

		btCollisionObject* concavebody = triBody;

		btConcaveShape* triangleMesh = (btConcaveShape*) concavebody->getCollisionShape();

		if (triangleMesh)
		{
			triangleMesh->processAllTriangles(&raycastCallback,rayAabbMin,rayAabbMax);
		}



		if (raycastCallback.m_hitFraction < convexbody->getHitFraction())
		{
			convexbody->setHitFraction( raycastCallback.m_hitFraction);
			return raycastCallback.m_hitFraction;
		}
	}

	return btScalar(1.);

}